

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

uint64_t __thiscall wasm::Literal::getUnsigned(Literal *this)

{
  BasicType BVar1;
  uint64_t uVar2;
  
  BVar1 = wasm::Type::getBasic(&this->type);
  if (BVar1 == i64) {
    uVar2 = (this->field_0).i64;
  }
  else {
    if (BVar1 != i32) {
      abort();
    }
    uVar2 = (uint64_t)(uint)(this->field_0).i32;
  }
  return uVar2;
}

Assistant:

uint64_t Literal::getUnsigned() const {
  switch (type.getBasic()) {
    case Type::i32:
      return static_cast<uint32_t>(i32);
    case Type::i64:
      return i64;
    default:
      abort();
  }
}